

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_util.h
# Opt level: O0

void webrtc::Interleave<float>
               (float **deinterleaved,size_t samples_per_channel,size_t num_channels,
               float *interleaved)

{
  float *pfVar1;
  ulong local_48;
  size_t j;
  size_t interleaved_idx;
  float *channel;
  size_t i;
  float *interleaved_local;
  size_t num_channels_local;
  size_t samples_per_channel_local;
  float **deinterleaved_local;
  
  for (channel = (float *)0x0; channel < num_channels; channel = (float *)((long)channel + 1)) {
    pfVar1 = deinterleaved[(long)channel];
    j = (size_t)channel;
    for (local_48 = 0; local_48 < samples_per_channel; local_48 = local_48 + 1) {
      interleaved[j] = pfVar1[local_48];
      j = num_channels + j;
    }
  }
  return;
}

Assistant:

void Interleave(const T* const* deinterleaved,
                size_t samples_per_channel,
                size_t num_channels,
                T* interleaved) {
  for (size_t i = 0; i < num_channels; ++i) {
    const T* channel = deinterleaved[i];
    size_t interleaved_idx = i;
    for (size_t j = 0; j < samples_per_channel; ++j) {
      interleaved[interleaved_idx] = channel[j];
      interleaved_idx += num_channels;
    }
  }
}